

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_floatval(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  
  if (nArg < 1) {
    aVar2.rVal = 0.0;
  }
  else {
    pjVar1 = *apArg;
    jx9MemObjToReal(pjVar1);
    aVar2 = pjVar1->x;
  }
  pjVar1 = pCtx->pRet;
  jx9MemObjRelease(pjVar1);
  pjVar1->x = aVar2;
  pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 4;
  jx9MemObjTryInteger(pjVar1);
  return 0;
}

Assistant:

static int jx9Builtin_floatval(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* return 0.0 */
		jx9_result_double(pCtx, 0);
	}else{
		double dval;
		/* Perform the cast */
		dval = jx9_value_to_double(apArg[0]);
		jx9_result_double(pCtx, dval);
	}
	return JX9_OK;
}